

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ckh.c
# Opt level: O0

_Bool ckh_search(ckh_t *ckh,void *searchkey,void **key,void **data)

{
  size_t sVar1;
  undefined8 *in_RCX;
  undefined8 *in_RDX;
  ckh_t *in_RSI;
  long in_RDI;
  size_t cell;
  undefined1 local_1;
  
  sVar1 = ckh_isearch(in_RSI,in_RDX);
  if (sVar1 == 0xffffffffffffffff) {
    local_1 = true;
  }
  else {
    if (in_RDX != (undefined8 *)0x0) {
      *in_RDX = *(undefined8 *)(*(long *)(in_RDI + 0x28) + sVar1 * 0x10);
    }
    if (in_RCX != (undefined8 *)0x0) {
      *in_RCX = *(undefined8 *)(*(long *)(in_RDI + 0x28) + sVar1 * 0x10 + 8);
    }
    local_1 = false;
  }
  return local_1;
}

Assistant:

bool
ckh_search(ckh_t *ckh, const void *searchkey, void **key, void **data) {
	size_t cell;

	assert(ckh != NULL);

	cell = ckh_isearch(ckh, searchkey);
	if (cell != SIZE_T_MAX) {
		if (key != NULL) {
			*key = (void *)ckh->tab[cell].key;
		}
		if (data != NULL) {
			*data = (void *)ckh->tab[cell].data;
		}
		return false;
	}

	return true;
}